

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

void testing::internal::
     SharedPayload<testing::internal::EqMatcher<std::pair<phmap::priv::NonStandardLayout,_int>_>_>::
     Destroy(SharedPayloadBase *shared)

{
  if (shared != (SharedPayloadBase *)0x0) {
    *(undefined ***)(shared + 2) = &PTR__NonStandardLayout_00323508;
    if (*(SharedPayloadBase **)(shared + 4) != shared + 8) {
      operator_delete(*(SharedPayloadBase **)(shared + 4),*(long *)(shared + 8) + 1);
    }
  }
  operator_delete(shared,0x38);
  return;
}

Assistant:

static void Destroy(SharedPayloadBase* shared) {
    delete static_cast<SharedPayload*>(shared);
  }